

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

bool __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this,
          ParseHandler<SGParser::Generator::RegExprNFAParseElement> *parseHandler)

{
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_00;
  TokenType *token;
  size_t *psVar1;
  TokenType TVar2;
  RegExprNFAParseElement *pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  TokenCode TVar7;
  int iVar8;
  const_iterator cVar9;
  size_t sVar10;
  TokenType TVar11;
  ulong uVar12;
  size_t *psVar13;
  size_t streamLength;
  ParseTable *pPVar14;
  long lVar15;
  size_t sVar16;
  uint j;
  uint left;
  ulong uVar17;
  TokenType local_60;
  TokenType tmpToken;
  TokenCode local_34;
  
  token = &this->Token;
  this_00 = &this->Stream;
  psVar1 = &this->ErrorMarker;
LAB_0013413a:
  if (this->TopState == 0xffffffff) {
    return false;
  }
  this->pStack[this->StackPosition].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
  State = this->TopState;
  if (this->NextTokenFlag != true) goto LAB_00134173;
LAB_00134167:
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken(this_00,token);
LAB_00134173:
  do {
    uVar5 = ParseTable::GetAction
                      (this->pParseTable,
                       this->pStack[this->StackPosition].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                       (this->Token).super_TokenCode.Code);
    if ((short)uVar5 < 0) break;
    uVar6 = 0;
    if ((uVar5 >> 0xe & 1) != 0) {
      if (uVar5 == 0x4fff) {
        return true;
      }
      uVar5 = uVar5 & 0x3fff;
      TVar7.Code = (CodeType)ParseTable::GetReduceProduction(this->pParseTable,uVar5);
      tmpToken.super_TokenCode.Code = TVar7.Code;
      uVar12 = (ulong)(TVar7.Code & 0xff);
      for (lVar15 = 0; -lVar15 != uVar12; lVar15 = lVar15 + -1) {
        sVar10 = this->pStack[this->StackPosition + lVar15].
                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker;
        if (sVar10 != 0xffffffffffffffff) {
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                    (this_00,sVar10);
        }
      }
      lVar15 = this->StackPosition - uVar12;
      this->StackPosition = lVar15 + 1;
      TVar7.Code = tmpToken.super_TokenCode.Code;
      left = tmpToken.super_TokenCode.Code >> 8 & 0x3fffff;
      uVar6 = ParseTable::GetLeftReduceState
                        (this->pParseTable,
                         this->pStack[lVar15].
                         super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,left)
      ;
      this->TopState = uVar6;
      if (uVar6 == 0xffffffff) {
        if (this->StackPosition == 0) {
          __assert_fail("StackPosition > 0u",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                        ,0x202,
                        "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                       );
        }
        this->StackPosition = this->StackPosition - 1;
        (this->Token).super_TokenCode.Code = 0;
        sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                           (this_00);
        this->PrevTokenIndex = sVar10;
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
        goto LAB_00134173;
      }
      this->NextTokenFlag = false;
      this->ReduceLeft = left;
      if (uVar12 == 0) {
        if (((byte)(this->pParseTable->StateInfos).
                   super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6] & 1) == 0) {
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
               0xffffffffffffffff;
        }
        else {
          sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                             (this_00);
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker = sVar10;
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar10)
          ;
        }
      }
      if (((TVar7.Code >> 0x1e & 1) == 0) &&
         (iVar8 = (*parseHandler->_vptr_ParseHandler[2])(parseHandler,this,(ulong)uVar5),
         (char)iVar8 == '\0')) goto LAB_00134789;
      if (-1 < (int)TVar7.Code) goto LAB_0013413a;
      local_34.Code = this->ReduceLeft << 0x10 | uVar5;
      cVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->pParseTable->ProductionErrorTerminals)._M_h,&local_34.Code);
      if (cVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) goto LAB_0013413a;
      uVar6 = *(uint *)((long)cVar9.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc) & 0xfffffff;
    }
    local_34.Code = uVar6;
    bVar4 = AdvancedInput(this);
    if ((bVar4) ||
       (sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetBufferedLength
                           (this_00,*psVar1), sVar10 == 0)) {
      if (*psVar1 != 0xffffffffffffffff) {
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                  (this_00,*psVar1);
      }
      sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                         (this_00);
      *psVar1 = sVar10 - 1;
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar10 - 1)
      ;
    }
    psVar13 = this->pValidTokenStackPositions;
    uVar12 = this->pParseTable->ActionWidth;
    for (lVar15 = 0; uVar12 * 8 - lVar15 != 0; lVar15 = lVar15 + 8) {
      *(undefined8 *)((long)psVar13 + lVar15) = 0xffffffffffffffff;
    }
    bVar4 = false;
    TVar11.super_TokenCode.Code = 0;
    TVar11.ch = 0;
    while( true ) {
      TVar2 = (TokenType)this->StackPosition;
      sVar10 = (long)TVar2 - (long)TVar11;
      if ((ulong)TVar2 < (ulong)TVar11) break;
      tmpToken = TVar11;
      uVar5 = ParseTable::GetAction
                        (this->pParseTable,
                         this->pStack[sVar10].
                         super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                         local_34.Code);
      sVar16 = sVar10;
      if ((uVar5 & 0xc000) != 0) {
        while( true ) {
          uVar6 = uVar5 & 0x3fff;
          if ((uVar5 >> 0xe & 1) == 0) break;
          uVar5 = ParseTable::GetReduceActionPopSize(this->pParseTable,uVar6);
          if (uVar5 == 0) goto LAB_001344b1;
          sVar16 = sVar16 - (uVar5 - 1);
          if (this->StackSize <= sVar16 - 1) {
            __assert_fail("pos > 0u && pos <= StackSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                          ,599,
                          "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                         );
          }
          uVar5 = ParseTable::GetReduceState
                            (this->pParseTable,
                             this->pStack[sVar16 - 1].
                             super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                             uVar6);
          if (uVar5 == 0xffffffff) goto LAB_001344b1;
          uVar5 = ParseTable::GetAction(this->pParseTable,uVar5,local_34.Code);
        }
        uVar5 = ParseTable::GetAction(this->pParseTable,uVar6,(token->super_TokenCode).Code);
        if ((uVar5 & 0xc000) != 0) {
          if ((ulong)TVar2 < (ulong)tmpToken) goto LAB_00134508;
          uVar5 = ParseTable::GetAction
                            (this->pParseTable,
                             this->pStack[this->StackPosition].
                             super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                             local_34.Code);
          if ((uVar5 >> 0xe & 1) != 0) goto LAB_001345b1;
          goto LAB_001345ac;
        }
LAB_001344b1:
        for (uVar17 = 0; (uVar12 & 0xffffffff) != uVar17; uVar17 = uVar17 + 1) {
          if ((this->pValidTokenStackPositions[uVar17] == 0xffffffffffffffff) &&
             (uVar5 = ParseTable::GetAction(this->pParseTable,uVar6,(uint)uVar17),
             (uVar5 & 0xc000) != 0)) {
            this->pValidTokenStackPositions[uVar17] = sVar10;
          }
        }
        bVar4 = true;
      }
      TVar11 = (TokenType)((long)tmpToken + 1);
    }
    if (!bVar4) {
      this->LastErrorState =
           this->pStack[(long)TVar2].super_ParseStackElement<SGParser::Generator::RegExprParseToken>
           .State;
      PrintStack(this,&this->ErrorStackStr);
LAB_00134789:
      CleanupParseStack(this,0);
      return false;
    }
LAB_00134508:
    if (this->pValidTokenStackPositions[(this->Token).super_TokenCode.Code] != 0xffffffffffffffff) {
      __assert_fail("pValidTokenStackPositions[Token.Code] == InvalidIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                    ,0x294,
                    "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                   );
    }
    TVar11 = *token;
    local_60 = TVar11;
    do {
      if (TVar11.super_TokenCode.Code.Code == 0) {
        uVar12 = this->PrevTokenIndex;
        sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                           (this_00);
        if (sVar10 <= uVar12) goto LAB_00134789;
      }
      else if (TVar11.super_TokenCode.Code.Code == 1) goto LAB_00134789;
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken
                (this_00,&local_60);
      TVar11 = (TokenType)((ulong)local_60 & 0xffffffff);
    } while (this->pValidTokenStackPositions[(long)TVar11] == 0xffffffffffffffff);
    uVar5 = ParseTable::GetAction
                      (this->pParseTable,
                       this->pStack[this->StackPosition].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                       local_34.Code);
    if ((uVar5 >> 0xe & 1) == 0) {
      sVar10 = this->pValidTokenStackPositions[(ulong)local_60 & 0xffffffff];
LAB_001345ac:
      CleanupParseStack(this,sVar10);
    }
LAB_001345b1:
    sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex(this_00)
    ;
    this->PrevTokenIndex = sVar10;
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
    (this->Token).super_TokenCode.Code = local_34.Code;
  } while( true );
  uVar12 = this->StackPosition + 1;
  this->StackPosition = uVar12;
  if (this->StackSize <= uVar12) {
    __assert_fail("StackPosition < StackSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                  ,0x1c8,
                  "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                 );
  }
  pRVar3 = this->pStack;
  pRVar3[uVar12].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State =
       uVar5 & 0x3fff;
  Generator::RegExprNFAParseElement::ShiftToken
            (pRVar3 + uVar12,token,
             &this_00->super_TokenStream<SGParser::Generator::RegExprParseToken>);
  pPVar14 = this->pParseTable;
  uVar5 = (this->Token).super_TokenCode.Code;
  if (((byte)(pPVar14->Terminals).
             super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5] & 1) != 0) {
    psVar13 = &this->pStack[this->StackPosition - 1].
               super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker;
    if (uVar5 == 0) {
      psVar13 = psVar1;
    }
    sVar10 = *psVar13;
    sVar16 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex(this_00)
    ;
    streamLength = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                   GetBufferedLength(this_00,sVar10);
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
              (this_00,sVar10,streamLength);
    if (((byte)(this->pParseTable->StateInfos).
               super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start
               [this->pStack[this->StackPosition].
                super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State] & 2) == 0) {
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekTo(this_00,sVar16);
    }
    else {
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                (this_00,this->pStack[this->StackPosition - 1].
                         super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                         TerminalMarker,0xffffffffffffffff);
    }
    (this->Stream).LengthLeft =
         -(ulong)((this->Stream).pSourceStream !=
                 (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0);
    pPVar14 = this->pParseTable;
  }
  if (((byte)(pPVar14->StateInfos).
             super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start
             [this->pStack[this->StackPosition].
              super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State] & 1) == 0) {
    this->pStack[this->StackPosition].
    super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
         0xffffffffffffffff;
  }
  else {
    sVar10 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex(this_00)
    ;
    this->pStack[this->StackPosition].
    super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker = sVar10;
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar10);
  }
  goto LAB_00134167;
}

Assistant:

bool Parse<StackElement>::DoParse(ParseHandler<StackElement>& parseHandler) {
    unsigned errorCode;

    // Continue to parse until we encounter an error or accept
    while (true) {
        // Check the top state to make sure it is valid
        if (TopState == InvalidState)
            return false;

        // Store result from the previous step
        pStack[StackPosition].State = TopState;

        // Get the token code if needed
        if (NextTokenFlag)
            GetNextToken(Token);

    try_next_action:
        // Keep shifting as long as 'Shift' action is selected
        auto actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        while (actionEntry & ParseTable::ShiftMask) {
            ++StackPosition;
            SG_ASSERT(StackPosition < StackSize);
            pStack[StackPosition].State = actionEntry & ParseTable::ExtractMask;

            // User callback (to get at token data)
            pStack[StackPosition].ShiftToken(Token, Stream);
            if (pParseTable->Terminals[Token.Code].ErrorTerminal) {
                const auto marker = Token.Code == TokenCode::TokenError
                                        ? ErrorMarker
                                        : pStack[StackPosition - 1u].TerminalMarker;
                const auto offset = Stream.GetTokenIndex();
                Stream.BacktrackToMarker(marker, Stream.GetBufferedLength(marker));
                pStack[StackPosition].SetErrorData(Token, Stream);
                // If it's a backtracking error, backtrack & retry the whole thing
                if (pParseTable->StateInfos[pStack[StackPosition].State].BacktrackOnError)
                    Stream.BacktrackToMarker(pStack[StackPosition - 1u].TerminalMarker);
                else
                    Stream.SeekTo(offset);
                Stream.SetMaxStreamLength();
            }

            // Start recording if needed
            if (pParseTable->StateInfos[pStack[StackPosition].State].Record)
                Stream.SetMarker(pStack[StackPosition].TerminalMarker = Stream.GetTokenIndex());
            else
                pStack[StackPosition].TerminalMarker = InvalidIndex;

            // Get next token
            GetNextToken(Token);
            // And get next action
            actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        }

        // Do Reduce
        if (actionEntry & ParseTable::ReduceMask) {
            // See if we have accepted
            if (actionEntry == ParseTable::AcceptValue)
                return true;

            // On reduce, this is the production Id
            const auto ReducedProd = actionEntry & ParseTable::ExtractMask;
            const auto rprod       = pParseTable->GetReduceProduction(ReducedProd);

            // Release all markers
            for (size_t i = 0u; i < size_t(rprod.Length); ++i)
                if (pStack[StackPosition - i].TerminalMarker != InvalidIndex)
                    Stream.ReleaseMarker(pStack[StackPosition - i].TerminalMarker);

            // Pop the production (size-1), (point to the top element
            // so it can be accessed with [])
            StackPosition = StackPosition + 1u - size_t(rprod.Length);
            // Get next state (consult goto)
            TopState      = pParseTable->GetLeftReduceState(pStack[StackPosition - 1u].State,
                                                            rprod.Left);
            if (TopState == InvalidState) {
                // Cleanup the stack, including [StackPosition].
                for (size_t i = size_t(rprod.Length + 1u); i > 0u; --i)
                    pStack[StackPosition + i - 1u].Cleanup();
                // Revert to previous stack position.
                SG_ASSERT(StackPosition > 0u);
                --StackPosition;
                // Set Token.Code to '%error', which will allow try_next_action to process
                // appropriately, with either shift or reduce.
                Token.Code     = TokenCode::TokenError;
                // Backtrack by one token so that the first valid token can be re-consumed
                // properly following an error.
                PrevTokenIndex = Stream.GetTokenIndex();
                Stream.SeekBack(1u);
                goto try_next_action;
            }
            NextTokenFlag = false;
            ReduceLeft    = rprod.Left;

            // If the Stack Position advanced we must make sure to set the terminal marker
            if (rprod.Length == 0u) {
                // Start recording if needed
                if (pParseTable->StateInfos[TopState].Record)
                    Stream.SetMarker(pStack[StackPosition].TerminalMarker =
                        Stream.GetTokenIndex());
                else
                    pStack[StackPosition].TerminalMarker = InvalidIndex;
            }

            // If the reduce function fails than return an error
            if (!rprod.NotReported && !parseHandler.Reduce(*this, ReducedProd))
                goto step_error;

            // Cleanup the stack after [StackPosition].
            // Leave the element at stack position unchanged since it holds the Reduce result.
            for (size_t i = size_t(rprod.Length); i > 0u; --i)
                pStack[StackPosition + i].Cleanup();

            // See if this production has to throw a named error
            if (rprod.ErrorTerminalFlag) {
                errorCode = ReducedProd | (ReduceLeft << 16u);
                if (const auto it = pParseTable->ProductionErrorTerminals.find(errorCode);
                    it != pParseTable->ProductionErrorTerminals.end()) {
                    errorCode = it->second;
                    errorCode &= ProductionMask::TerminalValue;
                    goto handle_error;
                }
            }
            continue;
        }

        // An Error has occurred, deal with it
        errorCode = TokenCode::TokenError;

    handle_error:
        // Note that if we haven't advanced input, it's the same error as before
        if (AdvancedInput() || Stream.GetBufferedLength(ErrorMarker) == 0u) {
            if (ErrorMarker != InvalidIndex)
                Stream.ReleaseMarker(ErrorMarker);
            ErrorMarker = Stream.GetTokenIndex() - 1u;
            Stream.SetMarker(ErrorMarker);
        }

        // Calculate valid token set
        bool       errorProdFound    = false;
        bool       nextActionValid   = false;
        size_t     nextStackPosition = 0u;
        const auto maxToken          = pParseTable->GetTerminalCount();
        std::fill(pValidTokenStackPositions, pValidTokenStackPositions + maxToken, InvalidIndex);

        // Search stack until a state with action on 'error' is found
        for (size_t i = 0u; i <= StackPosition; ++i) {
            const auto sp = StackPosition - i;
            actionEntry   = pParseTable->GetAction(pStack[sp].State, errorCode);
            if (actionEntry & (ParseTable::ShiftMask | ParseTable::ReduceMask)) {
                // If the action is reduce, we have to try reducing until we
                // finally shift the error token
                // Once we shift, we can look for the next valid token
                auto pos            = sp;
                auto actionVal      = actionEntry & ParseTable::ExtractMask;
                bool needNextAction = true;

                while (actionEntry & ParseTable::ReduceMask) {
                    // Check special case (Accept)
                    const auto length = pParseTable->GetReduceActionPopSize(actionVal);
                    if (length == 0u) {
                        needNextAction = false;
                        break;
                    }
                    pos -= length - 1u;
                    SG_ASSERT(pos > 0u && pos <= StackSize);
                    // Check special case (reduce state for action is invalid)
                    const auto state = pParseTable->GetReduceState(pStack[pos - 1u].State, actionVal);
                    if (state == InvalidState) {
                        needNextAction = false;
                        break;
                    }
                    actionEntry = pParseTable->GetAction(state, errorCode);
                    actionVal   = actionEntry & ParseTable::ExtractMask;
                }

                // We should be shifting next, so actionVal is a state that'll be
                // on stack once we shift error
                errorProdFound = true;

                if (needNextAction) {
                    const auto nextActionAfterError = pParseTable->GetAction(actionVal, Token.Code);
                    if ((nextActionAfterError & (ParseTable::ShiftMask | ParseTable::ReduceMask)) != 0) {
                        nextActionValid   = true;
                        nextStackPosition = sp;
                        break;
                    }
                }

                // Go through all symbols, and collect allowed tokens
                for (unsigned j = 0u; j < unsigned(maxToken); ++j)
                    if (pValidTokenStackPositions[j] == InvalidIndex)
                        if (pParseTable->GetAction(actionVal, j) & ParseTable::ActionMask)
                            pValidTokenStackPositions[j]  = sp;
            }
        }

        if (!errorProdFound) {
            LastErrorState = pStack[StackPosition].State;
            PrintStack(ErrorStackStr);
            goto step_error;
        }

        if (nextActionValid) {
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(nextStackPosition);
            }
        } else {
            // If an error production was found up the stack, we try to recover. This involves:
            //  1. Skipping all tokens, potentially including the last token that triggered the error,
            //     until a valid token is found.
            //       - No tokens may be skipped at all if the offending token is actually valid directly
            //         after an error. If you wrote "(5 + )" instead of "(5 + 5)" your original error
            //         token may be ')' but it doesn't actually need to be skipped.
            //         In this case, pValidTokenStackPositions[Token.Code] is valid up the stack, so no skipping
            //         takes place.
            //  2. Rolling back the stack, which includes StackPosition to a state that accepts
            //     an error followed by our next token. This is done by
            //         CleanupParseStack(pValidTokenStackPositions[Token.Code])
            //  3. Backtracking by one token and setting Token.Code to 'errorCode' to continue parsing.
            //         This will cause '%error' to be shifted onto the stack and allow things
            //         to move on with the next valid token after it.
            // (1.) Skip all 'unacceptable' tokens until a valid token, if any.
            SG_ASSERT(pValidTokenStackPositions[Token.Code] == InvalidIndex);
            TokenType tmpToken = Token;
            do {
                if (tmpToken.Code == TokenCode::TokenEOF) {
                    // If EOF was not in a valid look-ahead following %error, and we have hit
                    // the end of file, there is nothing left to do.
                    goto step_error;
                }
                if (tmpToken.Code == TokenCode::TokenError) {
                    // There are two reasons we can end up here:
                    //   a) Tokenizer generated TokenError because it saw unexpected characters,
                    //      which it had no reg-exp for. If this is the case, just skip them.
                    //   b) This is a second time through the error-handling loop for the same token.
                    //      We've already set Token.Code = errorCode for this token and tried
                    //      to recover, but for some reason this didn't work and we are back here.
                    //      Fail if this is the case.
                    if (PrevTokenIndex >= Stream.GetTokenIndex())
                        goto step_error;
                }
                GetNextToken(tmpToken);
            } while (pValidTokenStackPositions[tmpToken.Code] == InvalidIndex);
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // (2.) Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(pValidTokenStackPositions[tmpToken.Code]);
            }
        }
        // Set Token.Code to '%error', which will allow try_next_action to process appropriately,
        // with either shift or reduce. Also backtrack by one token so that the first valid token
        // can be re-consumed properly following an error.
        PrevTokenIndex = Stream.GetTokenIndex();
        Stream.SeekBack(1u);
        Token.Code = errorCode;
        goto try_next_action;
    }

step_error:
    // Clean up the parse stack by freeing all the elements
    CleanupParseStack();
    return false;
}